

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O2

char * net_boilerplate(int flag)

{
  char b [1000];
  
  b[0] = '\0';
  memcpy(buf,"\n   NrnThread* _nt;\n   int _tid = _pnt->_tid; \n   _nt = nrn_threads + _tid;\n",0x4d
        );
  strcpy(b,buf);
  sprintf(buf,
          "%s   _thread = (ThreadDatum*)0; \n   double *_weights = _nt->_weights;\n   _args = _weights ? _weights + _weight_index : nullptr;\n   _ml = _nt->_ml_list[_pnt->_type];\n   _cntml_actual = _ml->_nodecount;\n   _cntml_padded = _ml->_nodecount_padded;\n   _iml = _pnt->_i_instance;\n#if LAYOUT == 1 /*AoS*/\n   _p = _ml->_data + _iml*_psize; _ppvar = _ml->_pdata + _iml*_ppsize;\n#endif\n#if LAYOUT == 0 /*SoA*/\n   _p = _ml->_data; _ppvar = _ml->_pdata;\n#endif\n#if LAYOUT > 1 /*AoSoA*/\n#error AoSoA not implemented.\n#endif\n"
          ,b);
  return buf;
}

Assistant:

const char* net_boilerplate(int flag) {
	char b[1000];
	b[0] = '\0';
	
	sprintf(buf, "\n\
   NrnThread* _nt;\n\
   int _tid = _pnt->_tid; \n\
   _nt = nrn_threads + _tid;\n\
");

	sprintf(b, "%s", buf);

	sprintf(buf, "%s\
   _thread = (ThreadDatum*)0; \n\
   double *_weights = _nt->_weights;\n\
   _args = _weights ? _weights + _weight_index : nullptr;\n\
   _ml = _nt->_ml_list[_pnt->_type];\n\
   _cntml_actual = _ml->_nodecount;\n\
   _cntml_padded = _ml->_nodecount_padded;\n\
   _iml = _pnt->_i_instance;\n\
#if LAYOUT == 1 /*AoS*/\n\
   _p = _ml->_data + _iml*_psize; _ppvar = _ml->_pdata + _iml*_ppsize;\n\
#endif\n\
#if LAYOUT == 0 /*SoA*/\n\
   _p = _ml->_data; _ppvar = _ml->_pdata;\n\
#endif\n\
#if LAYOUT > 1 /*AoSoA*/\n\
#error AoSoA not implemented.\n\
#endif\n\
", b);
	return buf;
}